

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O3

void __thiscall DNSResolve::Close(DNSResolve *this)

{
  char *local_30;
  long local_28;
  char local_20 [16];
  
  Log::GetInstance();
  Log::FormatTime_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [info] ",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DNSResolve close\n",0x11);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  this->is_closed_ = true;
  if (this->event_loop_ != (EventLoop *)0x0) {
    EventLoop::Remove(this->event_loop_,this->dns_socket_);
  }
  CloseSocket(this->dns_socket_);
  return;
}

Assistant:

void DNSResolve::Close()
{
    LOGI << "DNSResolve close\n";
    is_closed_ = true;
    if (event_loop_)
    {
        event_loop_->Remove(dns_socket_);
    }
    CloseSocket(dns_socket_);
}